

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall UnifiedRegex::CharSet<char16_t>::Print(CharSet<char16_t> *this,DebugWriter *w)

{
  bool bVar1;
  Char CVar2;
  uint uVar3;
  uint u;
  uint i;
  uint u_00;
  uint uVar4;
  uint uVar5;
  
  DebugWriter::Print(w,L"[");
  u_00 = 0;
  uVar5 = 0xffffffff;
  do {
    if (u_00 == 0x10000) {
      if (-1 < (int)uVar5) {
        if (uVar5 < 0xfffe) {
          DebugWriter::Print(w,L"-");
        }
        DebugWriter::PrintEscapedChar(w,L'\xffff');
      }
      DebugWriter::Print(w,L"]");
      return;
    }
    CVar2 = Chars<char16_t>::UTC(u_00);
    bVar1 = Get(this,CVar2);
    uVar3 = uVar5;
    if (bVar1) {
      u = u_00;
      uVar4 = u_00;
      if ((int)uVar5 < 0) {
LAB_00cd9ecf:
        CVar2 = Chars<char16_t>::UTC(u);
        DebugWriter::PrintEscapedChar(w,CVar2);
        uVar3 = uVar4;
      }
    }
    else if ((-1 < (int)uVar5) && (uVar3 = 0xffffffff, uVar5 + 1 < u_00)) {
      if (uVar5 + 2 < u_00) {
        DebugWriter::Print(w,L"-");
      }
      u = u_00 - 1;
      uVar4 = 0xffffffff;
      goto LAB_00cd9ecf;
    }
    u_00 = u_00 + 1;
    uVar5 = uVar3;
  } while( true );
}

Assistant:

void CharSet<char16>::Print(DebugWriter* w) const
    {
        w->Print(_u("["));
        int start = -1;
        for (uint i = 0; i < NumChars; i++)
        {
            if (Get(UTC(i)))
            {
                if (start < 0)
                {
                    start = i;
                    w->PrintEscapedChar(UTC(i));
                }
            }
            else
            {
                if (start >= 0)
                {
                    if (i > (uint)(start + 1))
                    {
                        if (i  > (uint)(start + 2))
                            w->Print(_u("-"));
                        w->PrintEscapedChar(UTC(i - 1));
                    }
                    start = -1;
                }
            }
        }
        if (start >= 0)
        {
            if ((uint)start < MaxUChar - 1)
                w->Print(_u("-"));
            w->PrintEscapedChar(MaxChar);
        }
        w->Print(_u("]"));
    }